

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

Matrix * __thiscall Matrix::operator+=(Matrix *this,Matrix *m)

{
  double *pdVar1;
  double *pdVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  
  bVar3 = bShapeEqual(this,m);
  if (bVar3) {
    pdVar1 = m->pData;
    pdVar2 = this->pData;
    uVar5 = 0;
    uVar4 = (ulong)(uint)this->nData;
    if (this->nData < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      pdVar2[uVar5] = pdVar1[uVar5] + pdVar2[uVar5];
    }
  }
  return this;
}

Assistant:

Matrix &Matrix::operator+=(const Matrix&m)
{
	if( bShapeEqual(m) )
		for( int i=0; i<nData; i++ )
			pData[i] += m.pData[i];
	return *this;
}